

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::RepeatedField<unsigned_long>::InternalDeallocate<false>
          (RepeatedField<unsigned_long> *this)

{
  uint uVar1;
  int iVar2;
  void *ptr;
  RepeatedField<float> *this_00;
  uint size;
  int in_ESI;
  undefined1 *puVar3;
  LongSooRep *pLVar4;
  SooRep *pSVar5;
  Arena *this_01;
  SooRep *unaff_R14;
  Arena *pAStack_a0;
  ulong uStack_98;
  SooRep *pSStack_90;
  undefined1 auStack_58 [8];
  code *pcStack_50;
  undefined8 uStack_38;
  SooRep SStack_28;
  LongSooRep local_10;
  
  if ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0) {
    SStack_28.field_0.short_rep.field_1 = (anon_union_8_2_4f9aec01_for_ShortSooRep_1)0x145c2e;
    InternalDeallocate<false>(this);
    return;
  }
  pLVar4 = &local_10;
  SStack_28.field_0.short_rep.field_1 = (anon_union_8_2_4f9aec01_for_ShortSooRep_1)0x145c3d;
  InternalDeallocate<false>((RepeatedField<unsigned_long> *)pLVar4);
  if ((pLVar4->elements_int & 4) != 0) {
    uStack_38 = 0x145c4c;
    internal::LongSooRep::elements(pLVar4);
    return;
  }
  pSVar5 = &SStack_28;
  uStack_38 = 0x145c5f;
  heap_rep();
  iVar2 = 1;
  if (in_ESI == 0) {
    iVar2 = (pSVar5->field_0).long_rep.capacity;
  }
  if ((int)size <= iVar2) {
    internal::SooRep::set_size(pSVar5,SUB41(in_ESI,0),size);
    return;
  }
  pLVar4 = (LongSooRep *)(ulong)size;
  pcStack_50 = RepeatedField<float>::elements;
  set_size();
  uVar1 = 2;
  if (iVar2 == 0) {
    uVar1 = pLVar4->capacity;
  }
  if (0 < (int)uVar1) {
    if ((char)iVar2 != '\0') {
      return;
    }
    internal::LongSooRep::elements(pLVar4);
    return;
  }
  puVar3 = auStack_58;
  pSVar5 = (SooRep *)(ulong)uVar1;
  RepeatedField<float>::elements();
  if ((int)puVar3 < 0) {
    pSStack_90 = (SooRep *)0x145d0e;
    RepeatedField<float>::Mutable();
  }
  else {
    pSStack_90 = (SooRep *)0x145cde;
    iVar2 = internal::SooRep::size
                      (pSVar5,(undefined1  [16])
                              ((undefined1  [16])pSVar5->field_0 & (undefined1  [16])0x4) ==
                              (undefined1  [16])0x0);
    unaff_R14 = pSVar5;
    if ((int)puVar3 < iVar2) {
      pSStack_90 = (SooRep *)0x145cf4;
      RepeatedField<float>::elements
                ((RepeatedField<float> *)pSVar5,
                 (undefined1  [16])((undefined1  [16])pSVar5->field_0 & (undefined1  [16])0x4) ==
                 (undefined1  [16])0x0);
      return;
    }
  }
  this_01 = (Arena *)((ulong)puVar3 & 0xffffffff);
  pSStack_90 = (SooRep *)Arena::CreateArenaCompatible<google::protobuf::RepeatedField<float>>;
  RepeatedField<float>::Mutable();
  uStack_98 = (ulong)puVar3 & 0xffffffff;
  pSStack_90 = unaff_R14;
  if (this_01 == (Arena *)0x0) {
    this_00 = (RepeatedField<float> *)operator_new(0x10);
    RepeatedField<float>::RepeatedField(this_00,(Arena *)0x0);
  }
  else {
    ptr = Arena::Allocate(this_01,0x10);
    pAStack_a0 = this_01;
    Arena::InternalHelper<google::protobuf::RepeatedField<float>>::
    Construct<google::protobuf::Arena*>(ptr,&pAStack_a0);
  }
  return;
}

Assistant:

void InternalDeallocate() {
    ABSL_DCHECK(!is_soo());
    const size_t bytes = Capacity(false) * sizeof(Element) + kHeapRepHeaderSize;
    if (heap_rep()->arena == nullptr) {
      internal::SizedDelete(heap_rep(), bytes);
    } else if (!in_destructor) {
      // If we are in the destructor, we might be being destroyed as part of
      // the arena teardown. We can't try and return blocks to the arena then.
      heap_rep()->arena->ReturnArrayMemory(heap_rep(), bytes);
    }
  }